

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UriHelper.cpp
# Opt level: O1

Var Js::UriHelper::EncodeCoreURI(ScriptContext *scriptContext,Arguments *args,uchar flags)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  Var pvVar4;
  JavascriptString *strURI;
  
  if (((ulong)args->Info & 0xffffff) == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/UriHelper.cpp"
                                ,0xb,"(args.Info.Count > 0)","Should always have implicit \'this\'")
    ;
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  if (((ulong)args->Info & 0xfffffe) == 0) {
    strURI = StringCache::GetUndefinedDisplay
                       (&((scriptContext->super_ScriptContextBase).javascriptLibrary)->stringCache);
  }
  else {
    pvVar4 = Arguments::operator[](args,1);
    bVar2 = VarIs<Js::JavascriptString>(pvVar4);
    pvVar4 = Arguments::operator[](args,1);
    if (bVar2) {
      strURI = VarTo<Js::JavascriptString>(pvVar4);
    }
    else {
      strURI = JavascriptConversion::ToString(pvVar4,scriptContext);
    }
  }
  pvVar4 = Encode(strURI,flags,scriptContext);
  return pvVar4;
}

Assistant:

Var UriHelper::EncodeCoreURI(ScriptContext* scriptContext, Arguments& args, unsigned char flags )
    {
        AssertMsg(args.Info.Count > 0, "Should always have implicit 'this'");

        JavascriptString * strURI;
        //TODO make sure this string is pinned when the memory recycler is in
        if(args.Info.Count < 2)
        {
            strURI = scriptContext->GetLibrary()->GetUndefinedDisplayString();
        }
        else
        {

            if (VarIs<JavascriptString>(args[1]))
            {
                strURI = VarTo<JavascriptString>(args[1]);
            }
            else
            {
                strURI = JavascriptConversion::ToString(args[1], scriptContext);
            }
        }

        return Encode(strURI, flags, scriptContext);
    }